

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O2

size_t __thiscall
absl::lts_20240722::container_internal::PrepareInsertNonSoo
          (container_internal *this,CommonFields *common,size_t hash,FindInfo target,
          PolicyFunctions *policy)

{
  _func_void_CommonFields_ptr_size_t_HashtablezInfoHandle *p_Var1;
  GrowthInfo *pGVar2;
  size_t sVar3;
  size_t sVar4;
  HashtablezInfoHandle unaff_BL;
  PolicyFunctions *policy_00;
  FindInfo FVar5;
  
  policy_00 = (PolicyFunctions *)target.probe_length;
  pGVar2 = CommonFields::growth_info((CommonFields *)this);
  if ((long)pGVar2->growth_left_info_ < 1) {
    pGVar2 = CommonFields::growth_info((CommonFields *)this);
    if (pGVar2->growth_left_info_ == 0) {
      sVar4 = *(size_t *)this;
      p_Var1 = policy_00->resize;
      sVar3 = NextCapacity(sVar4);
      (*p_Var1)((CommonFields *)this,sVar3,unaff_BL);
      FVar5 = HashSetResizeHelper::FindFirstNonFullAfterResize
                        ((CommonFields *)this,sVar4,(size_t)common);
      hash = FVar5.offset;
    }
    else {
      sVar4 = CommonFields::growth_left((CommonFields *)this);
      if (sVar4 == 0) {
        FVar5 = anon_unknown_1::FindInsertPositionWithGrowthOrRehash
                          ((CommonFields *)this,(size_t)common,policy_00);
        hash = FVar5.offset;
      }
      else {
        FVar5 = find_first_non_full<void>((CommonFields *)this,(size_t)common);
        hash = FVar5.offset;
      }
    }
  }
  CommonFields::increment_size((CommonFields *)this);
  pGVar2 = CommonFields::growth_info((CommonFields *)this);
  GrowthInfo::OverwriteControlAsFull(pGVar2,*(ctrl_t *)(*(long *)(this + 0x10) + hash));
  SetCtrl((CommonFields *)this,hash,(ctrl_t)common & ~kEmpty,policy_00->slot_size);
  CommonFields::infoz((CommonFields *)this);
  return hash;
}

Assistant:

size_t PrepareInsertNonSoo(CommonFields& common, size_t hash, FindInfo target,
                           const PolicyFunctions& policy) {
  // When there are no deleted slots in the table
  // and growth_left is positive, we can insert at the first
  // empty slot in the probe sequence (target).
  const bool use_target_hint =
      // Optimization is disabled when generations are enabled.
      // We have to rehash even sparse tables randomly in such mode.
      !SwisstableGenerationsEnabled() &&
      common.growth_info().HasNoDeletedAndGrowthLeft();
  if (ABSL_PREDICT_FALSE(!use_target_hint)) {
    // Notes about optimized mode when generations are disabled:
    // We do not enter this branch if table has no deleted slots
    // and growth_left is positive.
    // We enter this branch in the following cases listed in decreasing
    // frequency:
    // 1. Table without deleted slots (>95% cases) that needs to be resized.
    // 2. Table with deleted slots that has space for the inserting element.
    // 3. Table with deleted slots that needs to be rehashed or resized.
    if (ABSL_PREDICT_TRUE(common.growth_info().HasNoGrowthLeftAndNoDeleted())) {
      const size_t old_capacity = common.capacity();
      policy.resize(common, NextCapacity(old_capacity), HashtablezInfoHandle{});
      target = HashSetResizeHelper::FindFirstNonFullAfterResize(
          common, old_capacity, hash);
    } else {
      // Note: the table may have no deleted slots here when generations
      // are enabled.
      const bool rehash_for_bug_detection =
          common.should_rehash_for_bug_detection_on_insert();
      if (rehash_for_bug_detection) {
        // Move to a different heap allocation in order to detect bugs.
        const size_t cap = common.capacity();
        policy.resize(common,
                      common.growth_left() > 0 ? cap : NextCapacity(cap),
                      HashtablezInfoHandle{});
      }
      if (ABSL_PREDICT_TRUE(common.growth_left() > 0)) {
        target = find_first_non_full(common, hash);
      } else {
        target = FindInsertPositionWithGrowthOrRehash(common, hash, policy);
      }
    }
  }
  PrepareInsertCommon(common);
  common.growth_info().OverwriteControlAsFull(common.control()[target.offset]);
  SetCtrl(common, target.offset, H2(hash), policy.slot_size);
  common.infoz().RecordInsert(hash, target.probe_length);
  return target.offset;
}